

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O1

string * __thiscall
Expr::SetFunc_abi_cxx11_(string *__return_storage_ptr__,Expr *this,Output *out,Env *env)

{
  size_type *psVar1;
  Expr *this_00;
  undefined8 *puVar2;
  Exception *this_01;
  ulong uVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string parent_val;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  string local_80;
  long *local_60;
  long local_58;
  long local_50 [2];
  string local_40;
  
  if (this->expr_type_ != EXPR_MEMBER) {
    if (this->expr_type_ == EXPR_ID) {
      set_function_abi_cxx11_(__return_storage_ptr__,this->id_);
      return __return_storage_ptr__;
    }
    this_01 = (Exception *)__cxa_allocate_exception(0x20);
    strfmt_abi_cxx11_(&local_40,"cannot generate set function for expression `%s\'",
                      (this->orig_)._M_dataplus._M_p);
    Exception::Exception(this_01,&this->super_Object,&local_40);
    __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
  }
  this_00 = this->operand_[0];
  GenEval(this_00,out,env);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,(this_00->str_)._M_dataplus._M_p,(allocator<char> *)&local_a0);
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_60,local_58 + (long)local_60);
  std::__cxx11::string::append((char *)&local_a0);
  set_function_abi_cxx11_(&local_80,this->operand_[1]->id_);
  uVar3 = 0xf;
  if (local_a0 != local_90) {
    uVar3 = local_90[0];
  }
  if (uVar3 < local_80._M_string_length + local_98) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      uVar4 = local_80.field_2._M_allocated_capacity;
    }
    if (local_80._M_string_length + local_98 <= (ulong)uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      goto LAB_0011ae5d;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80._M_dataplus._M_p);
LAB_0011ae5d:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar4 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string Expr::SetFunc(Output* out, Env* env)
	{
	switch ( expr_type_ )
		{
		case EXPR_ID:
			return set_function(id_);
		case EXPR_MEMBER:
			{
			// Evaluate the parent
			string parent_val(operand_[0]->EvalExpr(out, env));
			return parent_val + "->" + set_function(operand_[1]->id());
			}
			break;
		default:
			throw Exception(this, strfmt("cannot generate set function "
			                             "for expression `%s'",
			                             orig()));
			break;
		}
	}